

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O2

void Fxu_MatrixAddDivisor(Fxu_Matrix *p,Fxu_Cube *pCube1,Fxu_Cube *pCube2)

{
  Fxu_Double *pFVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  Fxu_Pair *pPair1;
  Fxu_Double *pLink;
  Fxu_ListDouble *pFVar5;
  int nLits2;
  int nLits1;
  int nBase;
  Fxu_Cube *pCube2_local;
  Fxu_Cube *pCube1_local;
  
  pCube2_local = pCube2;
  pCube1_local = pCube1;
  Fxu_PairCanonicize(&pCube1_local,&pCube2_local);
  uVar3 = Fxu_PairHashKey(p,pCube1_local,pCube2_local,&nBase,&nLits1,&nLits2);
  pPair1 = Fxu_PairAlloc(p,pCube1_local,pCube2_local);
  pPair1->nBase = nBase;
  pPair1->nLits1 = nLits1;
  pPair1->nLits2 = nLits2;
  uVar2 = (ulong)uVar3 % (ulong)(uint)p->nTableSize;
  pFVar5 = p->pTable + uVar2;
  while (pFVar1 = pFVar5->pHead, pFVar1 != (Fxu_Double *)0x0) {
    iVar4 = Fxu_PairCompare(pPair1,(pFVar1->lPairs).pTail);
    pLink = pFVar1;
    if (iVar4 != 0) goto LAB_003aa9aa;
    pFVar5 = (Fxu_ListDouble *)&pFVar1->pNext;
  }
  pLink = (Fxu_Double *)Fxu_MemFetch(p,0x40);
  pLink->Num = 0;
  pLink->HNum = 0;
  pLink->Weight = 0;
  pLink->Key = 0;
  (pLink->lPairs).pHead = (Fxu_Pair *)0x0;
  (pLink->lPairs).pTail = (Fxu_Pair *)0x0;
  *(undefined8 *)&(pLink->lPairs).nItems = 0;
  pLink->pPrev = (Fxu_Double *)0x0;
  pLink->pNext = (Fxu_Double *)0x0;
  pLink->pOrder = (Fxu_Double *)0x0;
  pLink->Key = (uint)uVar2;
  iVar4 = p->nDivsTotal;
  p->nDivsTotal = iVar4 + 1;
  pLink->Num = iVar4;
  Fxu_ListTableAddDivisor(p,pLink);
  pLink->Weight = pLink->Weight - (pPair1->nLits2 + pPair1->nLits1);
LAB_003aa9aa:
  Fxu_PairAdd(pPair1);
  pPair1->pDiv = pLink;
  Fxu_ListDoubleAddPairLast(pLink,pPair1);
  pLink->Weight = pPair1->nLits1 + pPair1->nLits2 + pPair1->nBase + pLink->Weight + -1;
  if (pFVar1 == (Fxu_Double *)0x0) {
    Fxu_HeapDoubleInsert(p->pHeapDouble,pLink);
  }
  else {
    Fxu_HeapDoubleUpdate(p->pHeapDouble,pLink);
  }
  return;
}

Assistant:

void Fxu_MatrixAddDivisor( Fxu_Matrix * p, Fxu_Cube * pCube1, Fxu_Cube * pCube2 )
{
	Fxu_Pair * pPair;
	Fxu_Double * pDiv;
    int nBase, nLits1, nLits2;
    int fFound;
	unsigned Key;

    // canonicize the pair
    Fxu_PairCanonicize( &pCube1, &pCube2 );
    // compute the hash key
    Key = Fxu_PairHashKey( p, pCube1, pCube2, &nBase, &nLits1, &nLits2 );

    // create the cube pair
    pPair = Fxu_PairAlloc( p, pCube1, pCube2 );
    pPair->nBase  = nBase;
    pPair->nLits1 = nLits1;
    pPair->nLits2 = nLits2;

    // check if the divisor for this pair already exists
    fFound = 0;
    Key %= p->nTableSize;
	Fxu_TableForEachDouble( p, Key, pDiv )
    {
		if ( Fxu_PairCompare( pPair, pDiv->lPairs.pTail ) ) // they are equal
        {
            fFound = 1;
            break;
        }
    }

    if ( !fFound )
    {   // create the new divisor
	    pDiv = MEM_ALLOC_FXU( p, Fxu_Double, 1 );
	    memset( pDiv, 0, sizeof(Fxu_Double) );
	    pDiv->Key = Key;
	    // set the number of this divisor
	    pDiv->Num = p->nDivsTotal++; // p->nDivs;
	    // insert the divisor in the table
	    Fxu_ListTableAddDivisor( p, pDiv );
	    // set the initial cost of the divisor
	    pDiv->Weight -= pPair->nLits1 + pPair->nLits2;
    }

	// link the pair to the cubes
	Fxu_PairAdd( pPair );
	// connect the pair and the divisor
	pPair->pDiv = pDiv;
	Fxu_ListDoubleAddPairLast( pDiv, pPair );	
    // update the max number of pairs in a divisor
//    if ( p->nPairsMax < pDiv->lPairs.nItems )
//        p->nPairsMax = pDiv->lPairs.nItems;
	// update the divisor's weight
	pDiv->Weight += pPair->nLits1 + pPair->nLits2 - 1 + pPair->nBase;
    if ( fFound ) // update the divisor in the heap
        Fxu_HeapDoubleUpdate( p->pHeapDouble, pDiv );
    else  // add the new divisor to the heap
        Fxu_HeapDoubleInsert( p->pHeapDouble, pDiv );
}